

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  undefined1 local_298 [8];
  basic_string_view<char,_std::char_traits<char>_> end_1;
  basic_string_view<char,_std::char_traits<char>_> begin_1;
  string_view pathv_1;
  basic_string_view<char,_std::char_traits<char>_> end;
  basic_string_view<char,_std::char_traits<char>_> begin;
  string_view pathv;
  RegularExpressionMatch match;
  string *origin_local;
  string *rpath_local;
  
  if (ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0') {
    iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::originRegex);
    if (iVar2 != 0) {
      cmsys::RegularExpression::RegularExpression
                (&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                   &__dso_handle);
      __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           originRegex);
    }
  }
  if (ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::originCurlyRegex);
    if (iVar2 != 0) {
      cmsys::RegularExpression::RegularExpression(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                   &__dso_handle);
      __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           originCurlyRegex);
    }
  }
  cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)&pathv._M_str);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,pcVar3,(RegularExpressionMatch *)&pathv._M_str);
  if (bVar1) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)rpath);
    pathv._M_len = auVar5._8_8_;
    begin._M_str = auVar5._0_8_;
    sVar4 = cmsys::RegularExpressionMatch::start((RegularExpressionMatch *)&pathv._M_str,1);
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)&begin._M_str,0,sVar4);
    sVar4 = cmsys::RegularExpressionMatch::end((RegularExpressionMatch *)&pathv._M_str,1);
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)&begin._M_str,sVar4,
                    0xffffffffffffffff);
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
              (__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&end._M_str,origin,
               (basic_string_view<char,_std::char_traits<char>_> *)&pathv_1._M_str);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,pcVar3,
                       (RegularExpressionMatch *)&pathv._M_str);
    if (bVar1) {
      auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)rpath);
      pathv_1._M_len = auVar5._8_8_;
      begin_1._M_str = auVar5._0_8_;
      sVar4 = cmsys::RegularExpressionMatch::start((RegularExpressionMatch *)&pathv._M_str);
      join_0x00000010_0x00000000_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&begin_1._M_str,0,sVar4);
      sVar4 = cmsys::RegularExpressionMatch::end((RegularExpressionMatch *)&pathv._M_str);
      _local_298 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&begin_1._M_str,
                              sVar4,0xffffffffffffffff);
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
                (__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&end_1._M_str,origin,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_298);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rpath);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start(1));
    auto end = pathv.substr(match.end(1));
    return cmStrCat(begin, origin, end);
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start());
    auto end = pathv.substr(match.end());
    return cmStrCat(begin, origin, end);
  }
  return rpath;
}